

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

int32_t __thiscall icu_63::UVector32::indexOf(UVector32 *this,int32_t key,int32_t startIndex)

{
  long lVar1;
  int32_t i;
  
  lVar1 = (long)startIndex;
  while( true ) {
    if (this->count <= lVar1) {
      return -1;
    }
    if (this->elements[lVar1] == key) break;
    lVar1 = lVar1 + 1;
  }
  return (int32_t)lVar1;
}

Assistant:

int32_t UVector32::indexOf(int32_t key, int32_t startIndex) const {
    int32_t i;
    for (i=startIndex; i<count; ++i) {
        if (key == elements[i]) {
            return i;
        }
    }
    return -1;
}